

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

int main(int argc,char **argv)

{
  ztast_t *ast;
  int iVar1;
  char acStack_88 [112];
  
  ztlex_selftest();
  ztlex_stringtest("");
  ztlex_stringtest(" ");
  ztlex_stringtest("x = 0;");
  ztlex_stringtest("y = [ 1 ];");
  ztlex_stringtest("()*+,-/;=[]{}");
  ztlex_stringtest("1.23");
  ztlex_stringtest("$FF");
  ztlex_stringtest("0xFF");
  ztlex_stringtest("255");
  ztlex_stringtest("potato");
  ztlex_stringtest("nil");
  ztlex_stringtest("1nil2");
  ztlex_stringtest(" 1 nil 2 ");
  iVar1 = 0;
  if (1 < argc) {
    ast = ztast_from_file(argv[1],acStack_88);
    if (ast == (ztast_t *)0x0) {
      fprintf(_stderr,"parse error: %s\n",acStack_88);
      fprintf(_stderr,"parse_and_dump_dot() returned error %x\n",0x40);
      iVar1 = 1;
    }
    else {
      ztast_destroy(ast);
      puts("ztast.dot created");
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
  ztresult_t rc = ztresult_OK;

  (void) Fortify_EnterScope();

  ztlex_selftest();

  ztlex_stringtest("");
  ztlex_stringtest(" ");
  ztlex_stringtest("x = 0;");
  ztlex_stringtest("y = [ 1 ];");
  ztlex_stringtest("()*+,-/;=[]{}"); /* no colon */
  ztlex_stringtest("1.23");
  ztlex_stringtest("$FF");
  ztlex_stringtest("0xFF");
  ztlex_stringtest("255");
  ztlex_stringtest("potato");
  ztlex_stringtest("nil");
  ztlex_stringtest("1nil2");
  ztlex_stringtest(" 1 nil 2 ");

  if (argc > 1)
  {
    rc = parse_and_dump_dot(argv[1], "ztast.dot");
    if (rc != ztresult_OK)
      fprintf(stderr, "parse_and_dump_dot() returned error %x\n", rc);
    else
      printf("ztast.dot created\n");
  }

  (void) Fortify_LeaveScope();

#ifdef FORTIFY
  printf("Fortify is enabled\n");
  Fortify_DumpAllMemory();
#endif

  return (rc == ztresult_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
}